

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

bool __thiscall
SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>::
EditingIterator::Next(EditingIterator *this)

{
  NodeBase *pNVar1;
  SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
  *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
  *pSVar6;
  
  pNVar1 = this->last;
  if ((pNVar1 == (NodeBase *)0x0) || (pNVar1->next == (this->super_Iterator).current)) {
    this->last = (this->super_Iterator).current;
  }
  else {
    (this->super_Iterator).current = pNVar1;
  }
  if ((this->super_Iterator).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pSVar2 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
            *)((this->super_Iterator).current)->next;
  bVar4 = pSVar2 != (this->super_Iterator).list;
  pSVar6 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
  if (bVar4) {
    pSVar6 = pSVar2;
  }
  (this->super_Iterator).current = &pSVar6->super_SListNodeBase<Memory::ArenaAllocator>;
  return bVar4;
}

Assistant:

bool Next()
        {
            if (last != nullptr && last->Next() != this->current)
            {
                this->current = last;
            }
            else
            {
                last = this->current;
            }
            return Iterator::Next();
        }